

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLexer.cpp
# Opt level: O0

void __thiscall TestLexer_TestString_Test::TestBody(TestLexer_TestString_Test *this)

{
  allocator<char> local_c1;
  string local_c0;
  Token local_a0;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  Lexer lexer;
  TestLexer_TestString_Test *this_local;
  
  lexer._40_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"\"Hi, this is a string.\"",&local_61);
  Lexer::Lexer((Lexer *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  Lexer::getToken(&local_a0,(Lexer *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Hi, this is a string.",&local_c1);
  checkToken(&local_a0,String,1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  Token::~Token(&local_a0);
  Lexer::~Lexer((Lexer *)local_40);
  return;
}

Assistant:

TEST(TestLexer, TestString) {
    Lexer lexer("\"Hi, this is a string.\"");
    checkToken(lexer.getToken(), TokenType::String, 1, "Hi, this is a string.");
}